

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          char *s)

{
  uint uVar1;
  size_t sVar2;
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  substr(&local_28,(size_type)this,pos1);
  sVar2 = strlen(s);
  __n = local_28.size_;
  if (sVar2 < local_28.size_) {
    __n = sVar2;
  }
  uVar1 = memcmp(local_28.data_,s,__n);
  if ((uVar1 == 0) && (uVar1 = 0, local_28.size_ != sVar2)) {
    uVar1 = -(uint)(local_28.size_ < sVar2) | 1;
  }
  return uVar1;
}

Assistant:

nssv_constexpr int compare( size_type pos1, size_type n1, CharT const * s ) const // (5)
    {
        return substr( pos1, n1 ).compare( basic_string_view( s ) );
    }